

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Transpose::backward_impl
          (Transpose *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  float *pfVar10;
  Index row;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int iVar22;
  int iVar23;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_50;
  
  if (((*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
         .super__Vector_impl_data._M_start)->d).bd != 0) {
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar12 = 0;
    do {
      uVar2 = (dEdf->d).nd;
      iVar22 = 1;
      if ((ulong)uVar2 != 0) {
        auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar18 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vmovdqa64_avx512f(auVar17);
          auVar17 = vporq_avx512f(auVar19,auVar15);
          auVar19 = vporq_avx512f(auVar19,auVar16);
          uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar17,auVar18,2);
          bVar8 = (byte)uVar6;
          uVar13 = CONCAT11(bVar8,bVar7);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
          auVar19._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar17._4_4_;
          auVar19._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
          auVar19._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar17._8_4_;
          auVar19._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar17._12_4_;
          auVar19._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar17._16_4_;
          auVar19._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar17._20_4_;
          auVar19._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar17._24_4_;
          auVar19._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar17._28_4_;
          auVar19._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
          auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
          auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
          auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
          auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
          auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
          auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
          auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar17 = vpmulld_avx512f(auVar19,auVar20);
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar9);
        auVar17 = vmovdqa32_avx512f(auVar17);
        auVar18._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_
        ;
        bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar18._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * auVar20._4_4_;
        bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar18._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * auVar20._8_4_;
        bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar18._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * auVar20._12_4_;
        bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar18._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * auVar20._16_4_;
        bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar18._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * auVar20._20_4_;
        bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar18._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * auVar20._24_4_;
        bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
        auVar18._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * auVar20._28_4_;
        auVar18._32_4_ =
             (uint)(bVar8 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar18._36_4_ = (uint)bVar3 * auVar17._36_4_ | (uint)!bVar3 * auVar20._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar18._40_4_ = (uint)bVar3 * auVar17._40_4_ | (uint)!bVar3 * auVar20._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar18._44_4_ = (uint)bVar3 * auVar17._44_4_ | (uint)!bVar3 * auVar20._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar18._48_4_ = (uint)bVar3 * auVar17._48_4_ | (uint)!bVar3 * auVar20._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar18._52_4_ = (uint)bVar3 * auVar17._52_4_ | (uint)!bVar3 * auVar20._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar18._56_4_ = (uint)bVar3 * auVar17._56_4_ | (uint)!bVar3 * auVar20._56_4_;
        auVar18._60_4_ =
             (uint)(bVar8 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
        auVar14 = vextracti64x4_avx512f(auVar18,1);
        auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar14));
        auVar4 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        iVar22 = auVar4._0_4_;
      }
      iVar23 = 1;
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v + (uVar12 % (dEdf->d).bd) * iVar22;
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdf->d).d[0];
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdf->d).d[1];
      if (uVar2 < 2) {
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      uVar2 = (dEdxi->d).nd;
      if ((ulong)uVar2 != 0) {
        auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar18 = vpbroadcastq_avx512f();
        uVar9 = 0;
        do {
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vmovdqa64_avx512f(auVar17);
          auVar17 = vporq_avx512f(auVar19,auVar15);
          auVar19 = vporq_avx512f(auVar19,auVar16);
          uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar17,auVar18,2);
          bVar8 = (byte)uVar6;
          uVar13 = CONCAT11(bVar8,bVar7);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar9));
          auVar21._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar17._4_4_;
          auVar21._0_4_ = (uint)(bVar7 & 1) * auVar17._0_4_;
          auVar21._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar17._8_4_;
          auVar21._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar17._12_4_;
          auVar21._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar17._16_4_;
          auVar21._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar17._20_4_;
          auVar21._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar17._24_4_;
          auVar21._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar17._28_4_;
          auVar21._32_4_ = (uint)(bVar8 & 1) * auVar17._32_4_;
          auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar17._36_4_;
          auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar17._40_4_;
          auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar17._44_4_;
          auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar17._48_4_;
          auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar17._52_4_;
          auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar17._56_4_;
          auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar17._60_4_;
          uVar9 = uVar9 + 0x10;
          auVar17 = vpmulld_avx512f(auVar21,auVar20);
        } while (((ulong)uVar2 + 0xf & 0x1fffffff0) != uVar9);
        auVar15 = vmovdqa32_avx512f(auVar17);
        auVar16._0_4_ = (uint)(bVar7 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_
        ;
        bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar16._4_4_ = (uint)bVar3 * auVar15._4_4_ | (uint)!bVar3 * auVar20._4_4_;
        bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar16._8_4_ = (uint)bVar3 * auVar15._8_4_ | (uint)!bVar3 * auVar20._8_4_;
        bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar16._12_4_ = (uint)bVar3 * auVar15._12_4_ | (uint)!bVar3 * auVar20._12_4_;
        bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar16._16_4_ = (uint)bVar3 * auVar15._16_4_ | (uint)!bVar3 * auVar20._16_4_;
        bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar16._20_4_ = (uint)bVar3 * auVar15._20_4_ | (uint)!bVar3 * auVar20._20_4_;
        bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar16._24_4_ = (uint)bVar3 * auVar15._24_4_ | (uint)!bVar3 * auVar20._24_4_;
        bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
        auVar16._28_4_ = (uint)bVar3 * auVar15._28_4_ | (uint)!bVar3 * auVar20._28_4_;
        auVar16._32_4_ =
             (uint)(bVar8 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar16._36_4_ = (uint)bVar3 * auVar15._36_4_ | (uint)!bVar3 * auVar20._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar16._40_4_ = (uint)bVar3 * auVar15._40_4_ | (uint)!bVar3 * auVar20._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar16._44_4_ = (uint)bVar3 * auVar15._44_4_ | (uint)!bVar3 * auVar20._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar16._48_4_ = (uint)bVar3 * auVar15._48_4_ | (uint)!bVar3 * auVar20._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar16._52_4_ = (uint)bVar3 * auVar15._52_4_ | (uint)!bVar3 * auVar20._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar16._56_4_ = (uint)bVar3 * auVar15._56_4_ | (uint)!bVar3 * auVar20._56_4_;
        auVar16._60_4_ =
             (uint)(bVar8 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
        auVar14 = vextracti64x4_avx512f(auVar16,1);
        auVar15 = vpmulld_avx512f(auVar16,ZEXT3264(auVar14));
        auVar4 = vpmulld_avx(auVar15._0_16_,auVar15._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        iVar23 = auVar4._0_4_;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v + (uVar12 % (dEdxi->d).bd) * iVar23;
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdxi->d).d[0];
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdxi->d).d[1];
      if (uVar2 < 2) {
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      Eigen::internal::
      check_for_aliasing<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>>
                (&local_70,&local_50);
      if ((local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value !=
           local_50.m_matrix.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value) ||
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value !=
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (0 < local_50.m_matrix.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value) {
        uVar9 = 0;
        do {
          if (0 < local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value) {
            uVar11 = 0;
            pfVar10 = local_50.m_matrix.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
            do {
              fVar1 = *pfVar10;
              pfVar10 = pfVar10 + local_50.m_matrix.
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                  .
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                  .m_rows.m_value;
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[uVar11] =
                   local_70.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data[uVar11] + fVar1;
              uVar11 = uVar11 + 1;
            } while (local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value != uVar11);
          }
          uVar9 = uVar9 + 1;
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_50.m_matrix.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data + 1;
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_70.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data + local_70.
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_rows.m_value;
        } while (uVar9 != local_50.m_matrix.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((*(xs->
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start)->d).bd);
  }
  return;
}

Assistant:

void Identity::backward_impl(const vector<const Tensor*>& xs,
                  const Tensor& fx,
                  const Tensor& dEdf,
                  unsigned i,
                  Tensor& dEdxi) const {
  *dEdxi += *dEdf;
}